

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

size_t __thiscall
CoreML::Specification::RandomNormalLikeLayerParams::ByteSizeLong(RandomNormalLikeLayerParams *this)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (this->seed_ == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = this->seed_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = (ulong)((int)lVar1 * 9 + 0x89U >> 6);
  }
  uVar3 = uVar2 + 5;
  if (this->mean_ == 0.0) {
    uVar3 = uVar2;
  }
  uVar2 = uVar3 + 5;
  if (this->stddev_ == 0.0) {
    uVar2 = uVar3;
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    uVar2 = uVar2 + *(long *)((uVar3 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)uVar2;
  return uVar2;
}

Assistant:

inline int64_t RandomNormalLikeLayerParams::_internal_seed() const {
  return seed_;
}